

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

int __thiscall
METADemuxer::addStream
          (METADemuxer *this,string *codec,string *codecStreamName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams)

{
  pointer *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  BufferedReaderManager *pBVar2;
  bool bVar3;
  undefined8 uVar4;
  MPLSParser *pMVar5;
  int pid_00;
  bool bVar6;
  __type _Var7;
  bool bVar8;
  uint uVar9;
  int32_t iVar10;
  MPLSParser *pMVar11;
  reference pvVar12;
  size_type sVar13;
  reference pvVar14;
  FileListIterator *this_00;
  ostream *poVar15;
  AbstractStreamReader *pAVar16;
  char *pcVar17;
  VodCoreException *pVVar18;
  pointer pSVar19;
  pointer ppVar20;
  AbstractStreamReader **fileSize_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  _Base_ptr local_1b00;
  BufferedReader *local_1ab8;
  ContainerToReaderWrapper *local_1a78;
  bool local_1a2a;
  ContainerToReaderWrapper *local_1a18;
  bool local_19da;
  bool local_19ba;
  ContainerToReaderWrapper *local_19a8;
  bool local_196a;
  ContainerToReaderWrapper *local_1948;
  bool local_18fa;
  ContainerToReaderWrapper *local_18d8;
  bool local_18a2;
  bool local_176d;
  _Self local_1730;
  allocator<char> local_1721;
  key_type local_1720;
  _Base_ptr local_1700;
  string local_16f8 [32];
  string local_16d8 [32];
  string local_16b8 [32];
  long local_1698;
  int64_t value;
  int64_t coeff;
  size_t pos;
  string timeShift;
  allocator<char> local_1651;
  key_type local_1650;
  _Self local_1630;
  const_iterator itr;
  PGSStreamReader *pgStream;
  undefined1 local_1618 [4];
  int streamIndex;
  reference local_1610;
  StreamInfo *streamInfo;
  BufferedReader *local_1600;
  BufferedFileReader *fileReader;
  string local_15f0;
  ostringstream local_15d0 [8];
  ostringstream ss_7;
  string local_1450;
  ostringstream local_1430 [8];
  ostringstream ss_6;
  allocator<char> local_12b1;
  string local_12b0;
  byte local_128b;
  byte local_128a;
  allocator<char> local_1289;
  string local_1288;
  byte local_1263;
  byte local_1262;
  allocator<char> local_1261;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  undefined1 local_1211;
  string local_1210;
  ostringstream local_11f0 [8];
  ostringstream ss_5;
  allocator<char> local_1071;
  string local_1070;
  byte local_104b;
  byte local_104a;
  allocator<char> local_1049;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  byte local_ffb;
  byte local_ffa;
  allocator<char> local_ff9;
  string local_ff8;
  allocator<char> local_fd1;
  string local_fd0;
  undefined1 local_fa9;
  string local_fa8;
  ostringstream local_f88 [8];
  ostringstream ss_4;
  allocator<char> local_e09;
  string local_e08;
  byte local_de3;
  byte local_de2;
  allocator<char> local_de1;
  string local_de0;
  allocator<char> local_db9;
  string local_db8;
  allocator<char> local_d91;
  string local_d90;
  undefined1 local_d69;
  string local_d68;
  ostringstream local_d48 [8];
  ostringstream ss_3;
  allocator<char> local_bc9;
  string local_bc8;
  byte local_ba3;
  byte local_ba2;
  allocator<char> local_ba1;
  string local_ba0;
  byte local_b7b;
  byte local_b7a;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  byte local_b2b;
  byte local_b2a;
  allocator<char> local_b29;
  string local_b28;
  byte local_b03;
  byte local_b02;
  allocator<char> local_b01;
  string local_b00;
  allocator<char> local_ad9;
  string local_ad8;
  string local_ab8;
  string local_a98;
  undefined1 local_a78 [8];
  string tmpname;
  AbstractReader *dataReader;
  AbstractStreamReader *local_a38;
  AbstractStreamReader *codecReader;
  int64_t tmpSize;
  string local_a20;
  ostringstream local_a00 [8];
  ostringstream ss_2;
  string *fileName_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  File tmpFile;
  _Self local_828;
  long local_820;
  int64_t fileSize;
  string *fileName_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  FileListIterator *listIterator;
  _Base_ptr local_7e8;
  undefined1 local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7c8;
  const_iterator local_7c0;
  _Self local_7b8;
  _Self local_7b0;
  string local_7a8;
  allocator<char> local_781;
  string local_780 [39];
  allocator<char> local_759;
  string local_758 [32];
  _Self local_738;
  allocator<char> local_729;
  key_type local_728;
  _Self local_708;
  allocator<char> local_6f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8;
  allocator<char> local_6b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  undefined1 local_650 [8];
  string trackKey;
  undefined1 local_628 [4];
  int i_1;
  undefined1 local_610 [8];
  MPLSStreamInfo streamInfo_1;
  undefined1 local_580 [8];
  string fileName;
  string local_558;
  ostringstream local_538 [8];
  ostringstream ss_1;
  string local_3b8;
  ostringstream local_398 [8];
  ostringstream ss;
  undefined1 local_220 [8];
  string playItemName;
  size_t i;
  reference local_1d8;
  MPLSParser *mplsInfo;
  size_t k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsNames;
  _Self local_198;
  byte local_18b;
  byte local_18a;
  allocator<char> local_189;
  key_type local_188;
  _Self local_168;
  bool local_159;
  undefined4 local_158;
  bool isSubStream;
  int ssPGOffset;
  int iStack_14c;
  bool isSSPG;
  int rightEyeSubStreamIdx;
  int leftEyeSubStreamIdx;
  vector<MPLSParser,_std::allocator<MPLSParser>_> mplsInfoList;
  undefined1 local_110 [8];
  string fileExt;
  string unquotedStreamName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileList;
  allocator<char> local_a9;
  key_type local_a8;
  _Base_ptr local_88;
  _Self local_80 [3];
  allocator<char> local_61;
  key_type local_60;
  _Self local_40;
  const_iterator tmpitr;
  int32_t pid;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *addParams_local;
  string *codecStreamName_local;
  string *codec_local;
  METADemuxer *this_local;
  
  tmpitr._M_node._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"track",&local_61);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(addParams,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_80[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(addParams);
  bVar6 = std::operator!=(&local_40,local_80);
  if (bVar6) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_40);
    pcVar17 = (char *)std::__cxx11::string::c_str();
    tmpitr._M_node._4_4_ = strToInt32(pcVar17);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"subTrack",&local_a9);
  local_88 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(addParams,&local_a8);
  local_40._M_node = local_88;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  fileList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(addParams);
  bVar6 = std::operator!=(&local_40,
                          (_Self *)&fileList.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pid_00 = tmpitr._M_node._4_4_;
  if (bVar6) {
    ppVar20 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_40);
    iVar10 = strToInt32(&ppVar20->second);
    tmpitr._M_node._4_4_ = SubTrackFilter::pidToSubPid(pid_00,iVar10);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&unquotedStreamName.field_2 + 8));
  unquoteStr((string *)((long)&fileExt.field_2 + 8),codecStreamName);
  extractFileExt((string *)
                 &mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,codecStreamName);
  strToLowerCase((string *)local_110,
                 (string *)
                 &mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &mplsInfoList.super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::vector
            ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)&rightEyeSubStreamIdx);
  iStack_14c = -1;
  ssPGOffset = -1;
  isSubStream = false;
  local_158 = 0xff;
  _Var7 = std::operator==(codec,&::h264DepCodecInfo.programName);
  local_18a = 0;
  local_18b = 0;
  local_176d = true;
  if (!_Var7) {
    std::allocator<char>::allocator();
    local_18a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"subClip",&local_189);
    local_18b = 1;
    local_168._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(addParams,&local_188);
    local_198._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    local_176d = std::operator!=(&local_168,&local_198);
  }
  if ((local_18b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_188);
  }
  if ((local_18a & 1) != 0) {
    std::allocator<char>::~allocator(&local_189);
  }
  local_159 = local_176d;
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_110,"mpls");
  if ((bVar6) ||
     (bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"mpl"), bVar6)) {
    getMplsInfo((vector<MPLSParser,_std::allocator<MPLSParser>_> *)
                &mplsNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this,codecStreamName);
    __x = &mplsNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::operator=
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)&rightEyeSubStreamIdx,
               (vector<MPLSParser,_std::allocator<MPLSParser>_> *)__x);
    std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
              ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)__x);
    pcVar17 = (char *)std::__cxx11::string::c_str();
    splitQuotedStr_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&k,pcVar17,'+');
    for (mplsInfo = (MPLSParser *)0x0; pMVar5 = mplsInfo,
        pMVar11 = (MPLSParser *)
                  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::size
                            ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)
                             &rightEyeSubStreamIdx), pMVar5 < pMVar11;
        mplsInfo = (MPLSParser *)((long)&mplsInfo->PlayList_playback_type + 1)) {
      local_1d8 = std::vector<MPLSParser,_std::allocator<MPLSParser>_>::operator[]
                            ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)
                             &rightEyeSubStreamIdx,(size_type)mplsInfo);
      pvVar14 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&k,(size_type)mplsInfo);
      unquoteStr((string *)&i,pvVar14);
      std::__cxx11::string::operator=((string *)(fileExt.field_2._M_local_buf + 8),(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      for (playItemName.field_2._8_8_ = 0; uVar4 = playItemName.field_2._8_8_,
          sVar13 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::size
                             (&local_1d8->m_playItems), (ulong)uVar4 < sVar13;
          playItemName.field_2._8_8_ = playItemName.field_2._8_8_ + 1) {
        std::__cxx11::string::string((string *)local_220);
        if ((local_159 & 1U) == 0) {
          pvVar12 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                              (&local_1d8->m_playItems,playItemName.field_2._8_8_);
          std::__cxx11::string::operator=((string *)local_220,(string *)&pvVar12->fileName);
        }
        else {
          bVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&local_1d8->m_mvcFiles);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream(local_398);
            std::operator<<((ostream *)local_398,
                            "Current playlist file doesn\'t has MVC track info. Please, remove MVC track from the track list"
                           );
            pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar18,0x1f6,&local_3b8);
            __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          sVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_1d8->m_mvcFiles);
          if (sVar13 <= (ulong)playItemName.field_2._8_8_) {
            std::__cxx11::ostringstream::ostringstream(local_538);
            std::operator<<((ostream *)local_538,
                            "Bad playlist file: number of CLPI files for AVC and VMC parts do not match"
                           );
            fileName.field_2._M_local_buf[0xf] = '\x01';
            pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar18,0x1f6,&local_558);
            fileName.field_2._M_local_buf[0xf] = '\0';
            __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          pvVar14 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_1d8->m_mvcFiles,playItemName.field_2._8_8_);
          std::__cxx11::string::operator=((string *)local_220,(string *)pvVar14);
        }
        mplsTrackToFullName((string *)local_580,(string *)((long)&fileExt.field_2 + 8),
                            (string *)local_220);
        if (((local_1d8->isDependStreamExist & 1U) != 0) &&
           (bVar6 = fileExists((string *)local_580), !bVar6)) {
          pvVar12 = std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator[]
                              (&local_1d8->m_playItems,playItemName.field_2._8_8_);
          mplsTrackToSSIFName((string *)&streamInfo_1.pipParams.lumma,
                              (string *)((long)&fileExt.field_2 + 8),&pvVar12->fileName);
          std::__cxx11::string::operator=
                    ((string *)local_580,(string *)&streamInfo_1.pipParams.lumma);
          std::__cxx11::string::~string((string *)&streamInfo_1.pipParams.lumma);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&unquotedStreamName.field_2 + 8),(value_type *)local_580);
        std::__cxx11::string::~string((string *)local_580);
        std::__cxx11::string::~string((string *)local_220);
      }
      MPLSParser::getStreamByPID((MPLSStreamInfo *)local_610,local_1d8,tmpitr._M_node._4_4_);
      if ((local_610._4_4_ == SUB_PGS) &&
         ((streamInfo_1.super_M2TSStreamInfo.m_index.
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0)) {
        iStack_14c = addPGSubStream(this,codec,(string *)((long)&fileExt.field_2 + 8),addParams,
                                    (MPLSStreamInfo *)streamInfo_1._64_8_);
        ssPGOffset = addPGSubStream(this,codec,(string *)((long)&fileExt.field_2 + 8),addParams,
                                    streamInfo_1.leftEye);
        isSubStream = (bool)(streamInfo_1.super_M2TSStreamInfo.m_index.
                             super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1);
        local_158 = streamInfo_1.super_M2TSStreamInfo.m_index.
                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_610);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&k);
  }
  else {
    extractFileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_628,codecStreamName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&unquotedStreamName.field_2 + 8),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_628);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_628);
  }
  sVar13 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&unquotedStreamName.field_2 + 8));
  trackKey.field_2._12_4_ = (undefined4)sVar13;
  while (trackKey.field_2._12_4_ = trackKey.field_2._12_4_ + -1, -1 < (int)trackKey.field_2._12_4_)
  {
    pvVar14 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),
                           (long)(int)trackKey.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"_#",&local_6b1);
    std::operator+(&local_690,pvVar14,&local_6b0);
    int32ToStr_abi_cxx11_(&local_6d8,(int32_t *)(trackKey.field_2._M_local_buf + 0xc));
    std::operator+(&local_670,&local_690,&local_6d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"_",&local_6f9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650,
                   &local_670,&local_6f8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_690);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::allocator<char>::~allocator(&local_6b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"subClip",&local_729);
    local_708._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(addParams,&local_728);
    local_738._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar6 = std::operator==(&local_708,&local_738);
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_758,"_track_",&local_759);
      std::__cxx11::string::operator+=((string *)local_650,local_758);
      std::__cxx11::string::~string(local_758);
      std::allocator<char>::~allocator(&local_759);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_780,"_subtrack_",&local_781);
      std::__cxx11::string::operator+=((string *)local_650,local_780);
      std::__cxx11::string::~string(local_780);
      std::allocator<char>::~allocator(&local_781);
    }
    int32ToStr_abi_cxx11_(&local_7a8,(int32_t *)((long)&tmpitr._M_node + 4));
    std::__cxx11::string::operator+=((string *)local_650,(string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_7a8);
    local_7b0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->m_processedTracks,(key_type *)local_650);
    local_7b8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->m_processedTracks);
    bVar6 = std::operator!=(&local_7b0,&local_7b8);
    if (bVar6) {
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&unquotedStreamName.field_2 + 8);
      local_7d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar1);
      local_7c8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_7d0,(long)(int)trackKey.field_2._12_4_);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_7c0,&local_7c8);
      local_7d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::erase(pvVar1,local_7c0);
    }
    else {
      pVar21 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert(&this->m_processedTracks,(value_type *)local_650);
      local_7e8 = (_Base_ptr)pVar21.first._M_node;
      local_7e0 = pVar21.second;
    }
    std::__cxx11::string::~string((string *)local_650);
  }
  bVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&unquotedStreamName.field_2 + 8));
  if (bVar6) {
    this_local._4_4_ = -1;
    listIterator._4_4_ = 1;
  }
  else {
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    sVar13 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&unquotedStreamName.field_2 + 8));
    if (1 < sVar13) {
      this_00 = (FileListIterator *)operator_new(0x28);
      FileListIterator::FileListIterator(this_00);
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00;
      std::vector<FileListIterator_*,_std::allocator<FileListIterator_*>_>::push_back
                (&this->m_iterators,(value_type *)&__range2);
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&unquotedStreamName.field_2 + 8);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar1);
      fileName_1 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(pvVar1);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&fileName_1), bVar6) {
        fileSize = (int64_t)__gnu_cxx::
                            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end2);
        FileListIterator::addFile((FileListIterator *)__range2,(string *)fileSize);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    local_820 = 0;
    pvVar14 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),0);
    local_828._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
         ::find(&(this->m_containerReader).m_demuxers,pvVar14);
    tmpFile.m_pos =
         (int64_t)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ContainerToReaderWrapper::DemuxerData>_>_>
                  ::end(&(this->m_containerReader).m_demuxers);
    bVar6 = std::operator==(&local_828,(_Self *)&tmpFile.m_pos);
    if (bVar6) {
      File::File((File *)&__range2_1);
      pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&unquotedStreamName.field_2 + 8);
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar1);
      fileName_2 = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(pvVar1);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&fileName_2), bVar6) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end2_1);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        uVar9 = File::open((File *)&__range2_1,pcVar17,1,0);
        if ((uVar9 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream(local_a00);
          poVar15 = std::operator<<((ostream *)local_a00,"Can\'t open file: ");
          pcVar17 = (char *)std::__cxx11::string::c_str();
          std::operator<<(poVar15,pcVar17);
          tmpSize._7_1_ = 1;
          pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(pVVar18,0x1f6,&local_a20);
          tmpSize._7_1_ = 0;
          __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        codecReader = (AbstractStreamReader *)0x0;
        fileSize_00 = &codecReader;
        File::size((File *)&__range2_1,(int64_t *)fileSize_00);
        local_820 = (long)&(codecReader->super_BaseAbstractStreamReader).
                           _vptr_BaseAbstractStreamReader + local_820;
        File::close((File *)&__range2_1,(int)fileSize_00);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      File::~File((File *)&__range2_1);
    }
    pvVar14 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),0);
    mergePlayItems((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&dataReader,
                   (vector<MPLSParser,_std::allocator<MPLSParser>_> *)&rightEyeSubStreamIdx);
    pAVar16 = createCodec(codec,addParams,pvVar14,
                          (vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&dataReader);
    std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector
              ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)&dataReader);
    local_a38 = pAVar16;
    sVar13 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::size(&this->m_codecInfo);
    (*(pAVar16->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0xb])
              (pAVar16,(ulong)((int)sVar13 + 1));
    (*(local_a38->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[0xc])
              (local_a38,(this->super_AbstractDemuxer).m_timeOffset);
    bVar6 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::empty(&this->m_codecInfo);
    if (bVar6) {
      local_a38->m_flags = local_a38->m_flags | 1;
    }
    pvVar14 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),0);
    strToLowerCase((string *)local_a78,pvVar14);
    trimStr(&local_ab8,(string *)local_a78);
    unquoteStr(&local_a98,&local_ab8);
    std::__cxx11::string::operator=((string *)local_a78,(string *)&local_a98);
    std::__cxx11::string::~string((string *)&local_a98);
    std::__cxx11::string::~string((string *)&local_ab8);
    std::allocator<char>::allocator();
    local_b02 = 0;
    local_b03 = 0;
    local_b2a = 0;
    local_b2b = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,".h264",&local_ad9);
    bVar6 = strEndWith((string *)local_a78,&local_ad8);
    local_18a2 = true;
    if (!bVar6) {
      std::allocator<char>::allocator();
      local_b02 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b00,".264",&local_b01);
      local_b03 = 1;
      bVar6 = strEndWith((string *)local_a78,&local_b00);
      local_18a2 = true;
      if (!bVar6) {
        std::allocator<char>::allocator();
        local_b2a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b28,".mvc",&local_b29);
        local_b2b = 1;
        local_18a2 = strEndWith((string *)local_a78,&local_b28);
      }
    }
    if ((local_b2b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b28);
    }
    if ((local_b2a & 1) != 0) {
      std::allocator<char>::~allocator(&local_b29);
    }
    if ((local_b03 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b00);
    }
    if ((local_b02 & 1) != 0) {
      std::allocator<char>::~allocator(&local_b01);
    }
    std::__cxx11::string::~string((string *)&local_ad8);
    std::allocator<char>::~allocator(&local_ad9);
    if (local_18a2 == false) {
      std::allocator<char>::allocator();
      local_b7a = 0;
      local_b7b = 0;
      local_ba2 = 0;
      local_ba3 = 0;
      bVar3 = false;
      bVar6 = false;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,".ts",&local_b51);
      bVar8 = strEndWith((string *)local_a78,&local_b50);
      local_18fa = true;
      if (!bVar8) {
        std::allocator<char>::allocator();
        local_b7a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,".m2ts",&local_b79);
        local_b7b = 1;
        bVar8 = strEndWith((string *)local_a78,&local_b78);
        local_18fa = true;
        if (!bVar8) {
          std::allocator<char>::allocator();
          local_ba2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,".mts",&local_ba1)
          ;
          local_ba3 = 1;
          bVar8 = strEndWith((string *)local_a78,&local_ba0);
          local_18fa = true;
          if (!bVar8) {
            std::allocator<char>::allocator();
            bVar3 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_bc8,".ssif",&local_bc9);
            bVar6 = true;
            local_18fa = strEndWith((string *)local_a78,&local_bc8);
          }
        }
      }
      if (bVar6) {
        std::__cxx11::string::~string((string *)&local_bc8);
      }
      if (bVar3) {
        std::allocator<char>::~allocator(&local_bc9);
      }
      if ((local_ba3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_ba0);
      }
      if ((local_ba2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_ba1);
      }
      if ((local_b7b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_b78);
      }
      if ((local_b7a & 1) != 0) {
        std::allocator<char>::~allocator(&local_b79);
      }
      std::__cxx11::string::~string((string *)&local_b50);
      std::allocator<char>::~allocator(&local_b51);
      if (local_18fa == false) {
        std::allocator<char>::allocator();
        local_de2 = 0;
        local_de3 = 0;
        bVar3 = false;
        bVar6 = false;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_db8,".vob",&local_db9);
        bVar8 = strEndWith((string *)local_a78,&local_db8);
        local_196a = true;
        if (!bVar8) {
          std::allocator<char>::allocator();
          local_de2 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_de0,".evo",&local_de1)
          ;
          local_de3 = 1;
          bVar8 = strEndWith((string *)local_a78,&local_de0);
          local_196a = true;
          if (!bVar8) {
            std::allocator<char>::allocator();
            bVar3 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e08,".mpg",&local_e09);
            bVar6 = true;
            local_196a = strEndWith((string *)local_a78,&local_e08);
          }
        }
        if (bVar6) {
          std::__cxx11::string::~string((string *)&local_e08);
        }
        if (bVar3) {
          std::allocator<char>::~allocator(&local_e09);
        }
        if ((local_de3 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_de0);
        }
        if ((local_de2 & 1) != 0) {
          std::allocator<char>::~allocator(&local_de1);
        }
        std::__cxx11::string::~string((string *)&local_db8);
        std::allocator<char>::~allocator(&local_db9);
        if (local_196a == false) {
          std::allocator<char>::allocator();
          local_104a = 0;
          local_104b = 0;
          bVar3 = false;
          bVar6 = false;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1020,".mkv",&local_1021);
          bVar8 = strEndWith((string *)local_a78,&local_1020);
          local_19da = true;
          if (!bVar8) {
            std::allocator<char>::allocator();
            local_104a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1048,".mka",&local_1049);
            local_104b = 1;
            bVar8 = strEndWith((string *)local_a78,&local_1048);
            local_19da = true;
            if (!bVar8) {
              std::allocator<char>::allocator();
              bVar3 = true;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1070,".mks",&local_1071);
              bVar6 = true;
              local_19da = strEndWith((string *)local_a78,&local_1070);
            }
          }
          if (bVar6) {
            std::__cxx11::string::~string((string *)&local_1070);
          }
          if (bVar3) {
            std::allocator<char>::~allocator(&local_1071);
          }
          if ((local_104b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1048);
          }
          if ((local_104a & 1) != 0) {
            std::allocator<char>::~allocator(&local_1049);
          }
          std::__cxx11::string::~string((string *)&local_1020);
          std::allocator<char>::~allocator(&local_1021);
          if (local_19da == false) {
            std::allocator<char>::allocator();
            local_1262 = 0;
            local_1263 = 0;
            local_128a = 0;
            local_128b = 0;
            bVar3 = false;
            bVar6 = false;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1238,".mov",&local_1239);
            bVar8 = strEndWith((string *)local_a78,&local_1238);
            local_1a2a = true;
            if (!bVar8) {
              std::allocator<char>::allocator();
              local_1262 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1260,".mp4",&local_1261);
              local_1263 = 1;
              bVar8 = strEndWith((string *)local_a78,&local_1260);
              local_1a2a = true;
              if (!bVar8) {
                std::allocator<char>::allocator();
                local_128a = 1;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1288,".m4v",&local_1289);
                local_128b = 1;
                bVar8 = strEndWith((string *)local_a78,&local_1288);
                local_1a2a = true;
                if (!bVar8) {
                  std::allocator<char>::allocator();
                  bVar3 = true;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_12b0,".m4a",&local_12b1);
                  bVar6 = true;
                  local_1a2a = strEndWith((string *)local_a78,&local_12b0);
                }
              }
            }
            if (bVar6) {
              std::__cxx11::string::~string((string *)&local_12b0);
            }
            if (bVar3) {
              std::allocator<char>::~allocator(&local_12b1);
            }
            if ((local_128b & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1288);
            }
            if ((local_128a & 1) != 0) {
              std::allocator<char>::~allocator(&local_1289);
            }
            if ((local_1263 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1260);
            }
            if ((local_1262 & 1) != 0) {
              std::allocator<char>::~allocator(&local_1261);
            }
            std::__cxx11::string::~string((string *)&local_1238);
            std::allocator<char>::~allocator(&local_1239);
            if (local_1a2a == false) {
              pBVar2 = this->m_readManager;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),0);
              pcVar17 = (char *)std::__cxx11::string::c_str();
              tmpname.field_2._8_8_ = BufferedReaderManager::getReader(pBVar2,pcVar17);
            }
            else {
              if (tmpitr._M_node._4_4_ == 0) {
                std::__cxx11::ostringstream::ostringstream(local_1430);
                std::operator<<((ostream *)local_1430,
                                "For streams inside MOV/MP4 container need track parameter.");
                pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
                std::__cxx11::ostringstream::str();
                VodCoreException::VodCoreException(pVVar18,0x1f6,&local_1450);
                __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException)
                ;
              }
              tmpname.field_2._8_8_ = &this->m_containerReader;
              if (__range2 !=
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
                if ((ContainerToReaderWrapper *)tmpname.field_2._8_8_ ==
                    (ContainerToReaderWrapper *)0x0) {
                  local_1a78 = (ContainerToReaderWrapper *)0x0;
                }
                else {
                  local_1a78 = (ContainerToReaderWrapper *)
                               __dynamic_cast(tmpname.field_2._8_8_,&AbstractReader::typeinfo,
                                              &ContainerToReaderWrapper::typeinfo,0);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&unquotedStreamName.field_2 + 8),0);
                pcVar17 = (char *)std::__cxx11::string::c_str();
                ContainerToReaderWrapper::setFileIterator
                          (local_1a78,pcVar17,(FileNameIterator *)__range2);
              }
              AbstractStreamReader::setSrcContainerType(local_a38,ctMOV);
            }
          }
          else {
            if (tmpitr._M_node._4_4_ == 0) {
              std::__cxx11::ostringstream::ostringstream(local_11f0);
              std::operator<<((ostream *)local_11f0,
                              "For streams inside MKV container need track parameter.");
              local_1211 = 1;
              pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              VodCoreException::VodCoreException(pVVar18,0x1f6,&local_1210);
              local_1211 = 0;
              __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            tmpname.field_2._8_8_ = &this->m_containerReader;
            if (__range2 !=
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
              if ((ContainerToReaderWrapper *)tmpname.field_2._8_8_ ==
                  (ContainerToReaderWrapper *)0x0) {
                local_1a18 = (ContainerToReaderWrapper *)0x0;
              }
              else {
                local_1a18 = (ContainerToReaderWrapper *)
                             __dynamic_cast(tmpname.field_2._8_8_,&AbstractReader::typeinfo,
                                            &ContainerToReaderWrapper::typeinfo,0);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),0);
              pcVar17 = (char *)std::__cxx11::string::c_str();
              ContainerToReaderWrapper::setFileIterator
                        (local_1a18,pcVar17,(FileNameIterator *)__range2);
            }
            AbstractStreamReader::setSrcContainerType(local_a38,ctMKV);
          }
        }
        else {
          if (tmpitr._M_node._4_4_ == 0) {
            std::__cxx11::ostringstream::ostringstream(local_f88);
            std::operator<<((ostream *)local_f88,
                            "For streams inside MPG/VOB/EVO container need track parameter.");
            local_fa9 = 1;
            pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar18,0x1f6,&local_fa8);
            local_fa9 = 0;
            __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
          tmpname.field_2._8_8_ = &this->m_containerReader;
          if (__range2 !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            if ((ContainerToReaderWrapper *)tmpname.field_2._8_8_ == (ContainerToReaderWrapper *)0x0
               ) {
              local_19a8 = (ContainerToReaderWrapper *)0x0;
            }
            else {
              local_19a8 = (ContainerToReaderWrapper *)
                           __dynamic_cast(tmpname.field_2._8_8_,&AbstractReader::typeinfo,
                                          &ContainerToReaderWrapper::typeinfo,0);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&unquotedStreamName.field_2 + 8),0);
            pcVar17 = (char *)std::__cxx11::string::c_str();
            ContainerToReaderWrapper::setFileIterator
                      (local_19a8,pcVar17,(FileNameIterator *)__range2);
          }
          std::allocator<char>::allocator();
          local_ffa = 0;
          local_ffb = 0;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_fd0,".evo",&local_fd1)
          ;
          bVar6 = strEndWith((string *)local_a78,&local_fd0);
          local_19ba = true;
          if (!bVar6) {
            std::allocator<char>::allocator();
            local_ffa = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_ff8,".evo\"",&local_ff9);
            local_ffb = 1;
            local_19ba = strEndWith((string *)local_a78,&local_ff8);
          }
          if ((local_ffb & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_ff8);
          }
          if ((local_ffa & 1) != 0) {
            std::allocator<char>::~allocator(&local_ff9);
          }
          std::__cxx11::string::~string((string *)&local_fd0);
          std::allocator<char>::~allocator(&local_fd1);
          if (local_19ba == false) {
            AbstractStreamReader::setSrcContainerType(local_a38,ctVOB);
          }
          else {
            AbstractStreamReader::setSrcContainerType(local_a38,ctEVOB);
          }
        }
      }
      else {
        if (tmpitr._M_node._4_4_ == 0) {
          std::__cxx11::ostringstream::ostringstream(local_d48);
          std::operator<<((ostream *)local_d48,
                          "For streams inside TS/M2TS container need track parameter.");
          local_d69 = 1;
          pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          VodCoreException::VodCoreException(pVVar18,0x1f6,&local_d68);
          local_d69 = 0;
          __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        tmpname.field_2._8_8_ = &this->m_containerReader;
        if (__range2 !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          if ((ContainerToReaderWrapper *)tmpname.field_2._8_8_ == (ContainerToReaderWrapper *)0x0)
          {
            local_1948 = (ContainerToReaderWrapper *)0x0;
          }
          else {
            local_1948 = (ContainerToReaderWrapper *)
                         __dynamic_cast(tmpname.field_2._8_8_,&AbstractReader::typeinfo,
                                        &ContainerToReaderWrapper::typeinfo,0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&unquotedStreamName.field_2 + 8),0);
          pcVar17 = (char *)std::__cxx11::string::c_str();
          ContainerToReaderWrapper::setFileIterator(local_1948,pcVar17,(FileNameIterator *)__range2)
          ;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,".ts",&local_d91);
        bVar6 = strEndWith((string *)local_a78,&local_d90);
        std::__cxx11::string::~string((string *)&local_d90);
        std::allocator<char>::~allocator(&local_d91);
        if (bVar6) {
          AbstractStreamReader::setSrcContainerType(local_a38,ctTS);
        }
        else {
          AbstractStreamReader::setSrcContainerType(local_a38,ctM2TS);
        }
      }
    }
    else if (tmpitr._M_node._4_4_ == 0) {
      pBVar2 = this->m_readManager;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&unquotedStreamName.field_2 + 8),0);
      pcVar17 = (char *)std::__cxx11::string::c_str();
      tmpname.field_2._8_8_ = BufferedReaderManager::getReader(pBVar2,pcVar17);
    }
    else {
      tmpname.field_2._8_8_ = &this->m_containerReader;
      AbstractStreamReader::setSrcContainerType(local_a38,ctMultiH264);
      if (__range2 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        if (tmpname.field_2._8_8_ == 0) {
          local_18d8 = (ContainerToReaderWrapper *)0x0;
        }
        else {
          local_18d8 = (ContainerToReaderWrapper *)
                       __dynamic_cast(tmpname.field_2._8_8_,&AbstractReader::typeinfo,
                                      &ContainerToReaderWrapper::typeinfo,0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&unquotedStreamName.field_2 + 8),0);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        ContainerToReaderWrapper::setFileIterator(local_18d8,pcVar17,(FileNameIterator *)__range2);
      }
    }
    if (tmpname.field_2._8_8_ == 0) {
      if (local_a38 != (AbstractStreamReader *)0x0) {
        (*(local_a38->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[1])();
      }
      std::__cxx11::ostringstream::ostringstream(local_15d0);
      std::operator<<((ostream *)local_15d0,
                      "This version do not support multicast or other network steams for muxing");
      fileReader._7_1_ = 1;
      pVVar18 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar18,0x1f6,&local_15f0);
      fileReader._7_1_ = 0;
      __cxa_throw(pVVar18,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    pvVar14 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&unquotedStreamName.field_2 + 8),0);
    std::vector<StreamInfo,std::allocator<StreamInfo>>::
    emplace_back<AbstractReader*&,AbstractStreamReader*&,std::__cxx11::string&,std::__cxx11::string_const&,int&,bool&>
              ((vector<StreamInfo,std::allocator<StreamInfo>> *)&this->m_codecInfo,
               (AbstractReader **)((long)&tmpname.field_2 + 8),&local_a38,pvVar14,codecStreamName,
               (int *)((long)&tmpitr._M_node + 4),&local_159);
    if (__range2 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      if (tmpname.field_2._8_8_ == 0) {
        local_1ab8 = (BufferedReader *)0x0;
      }
      else {
        local_1ab8 = (BufferedReader *)
                     __dynamic_cast(tmpname.field_2._8_8_,&AbstractReader::typeinfo,
                                    &BufferedFileReader::typeinfo,0);
      }
      pvVar1 = __range2;
      local_1600 = local_1ab8;
      if (local_1ab8 != (BufferedReader *)0x0) {
        std::vector<StreamInfo,_std::allocator<StreamInfo>_>::rbegin
                  ((vector<StreamInfo,_std::allocator<StreamInfo>_> *)&streamInfo);
        pSVar19 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>_>
                                *)&streamInfo);
        BufferedReader::setFileIterator(local_1ab8,(FileNameIterator *)pvVar1,pSVar19->m_readerID);
      }
    }
    std::vector<StreamInfo,_std::allocator<StreamInfo>_>::rbegin
              ((vector<StreamInfo,_std::allocator<StreamInfo>_> *)local_1618);
    local_1610 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>_>
                              *)local_1618);
    std::__cxx11::string::operator=((string *)&local_1610->m_codec,(string *)codec);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&local_1610->m_addParams,addParams);
    this_local._4_4_ = AbstractStreamReader::getStreamIndex(local_a38);
    if (local_a38 == (AbstractStreamReader *)0x0) {
      local_1b00 = (_Base_ptr)0x0;
    }
    else {
      local_1b00 = (_Base_ptr)
                   __dynamic_cast(local_a38,&AbstractStreamReader::typeinfo,
                                  &PGSStreamReader::typeinfo,0);
    }
    itr._M_node = local_1b00;
    if (local_1b00 != (_Base_ptr)0x0) {
      *(byte *)&local_1b00[2]._M_right = isSubStream & 1;
      *(undefined4 *)&local_1b00[3].field_0x4 = local_158;
      *(int *)((long)&local_1b00[2]._M_right + 4) = iStack_14c;
      local_1b00[3]._M_color = ssPGOffset;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1650,"timeshift",&local_1651);
    local_1630._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(addParams,&local_1650);
    std::__cxx11::string::~string((string *)&local_1650);
    std::allocator<char>::~allocator(&local_1651);
    timeShift.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar6 = std::operator!=(&local_1630,(_Self *)((long)&timeShift.field_2 + 8));
    if (bVar6) {
      ppVar20 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_1630);
      std::__cxx11::string::string((string *)&pos,(string *)&ppVar20->second);
      coeff = 0;
      value = 1;
      local_1698 = 0;
      coeff = std::__cxx11::string::find((char *)&pos,0x3bb3e8);
      if (coeff == -1) {
        coeff = std::__cxx11::string::find((char)&pos,0x73);
        if (coeff == -1) {
          coeff = std::__cxx11::string::find((char *)&pos,0x3bbc0d);
          if (coeff == -1) {
            value = 1000000;
            pcVar17 = (char *)std::__cxx11::string::c_str();
            iVar10 = strToInt32(pcVar17);
            local_1698 = (long)iVar10;
          }
          else {
            value = 1;
            std::__cxx11::string::substr((ulong)local_16f8,(ulong)&pos);
            pcVar17 = (char *)std::__cxx11::string::c_str();
            iVar10 = strToInt32(pcVar17);
            local_1698 = (long)iVar10;
            std::__cxx11::string::~string(local_16f8);
          }
        }
        else {
          value = 1000000000;
          std::__cxx11::string::substr((ulong)local_16d8,(ulong)&pos);
          pcVar17 = (char *)std::__cxx11::string::c_str();
          iVar10 = strToInt32(pcVar17);
          local_1698 = (long)iVar10;
          std::__cxx11::string::~string(local_16d8);
        }
      }
      else {
        value = 1000000;
        std::__cxx11::string::substr((ulong)local_16b8,(ulong)&pos);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        iVar10 = strToInt32(pcVar17);
        local_1698 = (long)iVar10;
        std::__cxx11::string::~string(local_16b8);
      }
      local_1698 = (((local_1698 * value) / 1000) * 0x13b6d8300) / 1000000;
      local_1610->m_timeShift = local_1698;
      if (0 < local_1698) {
        local_1610->m_lastDTS = local_1698;
      }
      std::__cxx11::string::~string((string *)&pos);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1720,"lang",&local_1721);
    local_1700 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(addParams,&local_1720);
    local_1630._M_node = local_1700;
    std::__cxx11::string::~string((string *)&local_1720);
    std::allocator<char>::~allocator(&local_1721);
    local_1730._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(addParams);
    bVar6 = std::operator!=(&local_1630,&local_1730);
    if (bVar6) {
      ppVar20 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_1630);
      std::__cxx11::string::operator=((string *)&local_1610->m_lang,(string *)&ppVar20->second);
    }
    this->m_totalSize = local_820 + this->m_totalSize;
    listIterator._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_a78);
  }
  std::vector<MPLSParser,_std::allocator<MPLSParser>_>::~vector
            ((vector<MPLSParser,_std::allocator<MPLSParser>_> *)&rightEyeSubStreamIdx);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)(fileExt.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&unquotedStreamName.field_2 + 8));
  return this_local._4_4_;
}

Assistant:

int METADemuxer::addStream(const string& codec, const string& codecStreamName, const map<string, string>& addParams)
{
    int32_t pid = 0;
    auto tmpitr = addParams.find("track");
    if (tmpitr != addParams.end())
        pid = strToInt32(tmpitr->second.c_str());

    tmpitr = addParams.find("subTrack");
    if (tmpitr != addParams.end())
        pid = SubTrackFilter::pidToSubPid(pid, strToInt32(tmpitr->second));

    vector<string> fileList;
    string unquotedStreamName = unquoteStr(codecStreamName);
    string fileExt = strToLowerCase(extractFileExt(codecStreamName));
    std::vector<MPLSParser> mplsInfoList;

    // filds for SS PG
    int leftEyeSubStreamIdx = -1;
    int rightEyeSubStreamIdx = -1;
    bool isSSPG = false;
    int ssPGOffset = 0xff;
    ////

    bool isSubStream = (codec == h264DepCodecInfo.programName) || addParams.find("subClip") != addParams.end();
    if (fileExt == "mpls" || fileExt == "mpl")
    {
        mplsInfoList = getMplsInfo(codecStreamName);
        vector<string> mplsNames = splitQuotedStr(codecStreamName.c_str(), '+');
        for (size_t k = 0; k < mplsInfoList.size(); ++k)
        {
            MPLSParser& mplsInfo = mplsInfoList[k];
            unquotedStreamName = unquoteStr(mplsNames[k]);
            for (size_t i = 0; i < mplsInfo.m_playItems.size(); ++i)
            {
                string playItemName;
                if (isSubStream)
                {
                    if (mplsInfo.m_mvcFiles.empty())
                    {
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Current playlist file doesn't has MVC track info. Please, remove MVC track from the "
                              "track list")
                    }
                    if (mplsInfo.m_mvcFiles.size() <= i)
                        THROW(ERR_INVALID_CODEC_FORMAT,
                              "Bad playlist file: number of CLPI files for AVC and VMC parts do not match")
                    playItemName = mplsInfo.m_mvcFiles[i];
                }
                else
                {
                    playItemName = mplsInfo.m_playItems[i].fileName;
                }
                string fileName = mplsTrackToFullName(unquotedStreamName, playItemName);
                if (mplsInfo.isDependStreamExist && !fileExists(fileName))
                    fileName = mplsTrackToSSIFName(unquotedStreamName, mplsInfo.m_playItems[i].fileName);
                fileList.push_back(fileName);
            }

            MPLSStreamInfo streamInfo = mplsInfo.getStreamByPID(pid);
            if (streamInfo.stream_coding_type == StreamType::SUB_PGS && streamInfo.isSSPG)
            {
                // add refs to addition tracks for stereo subtitles
                leftEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.leftEye);
                rightEyeSubStreamIdx = addPGSubStream(codec, unquotedStreamName, addParams, streamInfo.rightEye);

                isSSPG = streamInfo.isSSPG;
                ssPGOffset = streamInfo.SS_PG_offset_sequence_id;
            }
        }
    }
    else
    {
        fileList = extractFileList(codecStreamName);
    }

    for (int i = static_cast<int>(fileList.size()) - 1; i >= 0; --i)
    {
        string trackKey = fileList[i] + string("_#") + int32ToStr(i) + string("_");
        if (addParams.find("subClip") == addParams.end())
            trackKey += string("_track_");
        else
            trackKey += string("_subtrack_");
        trackKey += int32ToStr(pid);
        if (m_processedTracks.find(trackKey) != m_processedTracks.end())
            fileList.erase(fileList.begin() + i);
        else
            m_processedTracks.insert(trackKey);
    }
    if (fileList.empty())
        return -1;

    FileListIterator* listIterator = nullptr;
    if (fileList.size() > 1)
    {
        listIterator = new FileListIterator();
        m_iterators.push_back(listIterator);
        for (const string& fileName : fileList) listIterator->addFile(fileName);
    }

    int64_t fileSize = 0;

    if (m_containerReader.m_demuxers.find(fileList[0]) == m_containerReader.m_demuxers.end())
    {
        File tmpFile;
        for (const string& fileName : fileList)
        {
            if (!tmpFile.open(fileName.c_str(), File::ofRead))
                THROW(ERR_INVALID_CODEC_FORMAT, "Can't open file: " << fileName.c_str())
            int64_t tmpSize = 0;
            tmpFile.size(&tmpSize);
            fileSize += tmpSize;
            tmpFile.close();
        }
    }

    AbstractStreamReader* codecReader = createCodec(codec, addParams, fileList[0], mergePlayItems(mplsInfoList));
    codecReader->setStreamIndex(static_cast<int>(m_codecInfo.size() + 1));
    codecReader->setTimeOffset(m_timeOffset);

    if (m_codecInfo.empty())
        codecReader->m_flags |= AVPacket::PCR_STREAM;

    AbstractReader* dataReader;
    string tmpname = strToLowerCase(fileList[0]);
    tmpname = unquoteStr(trimStr(tmpname));

    if (strEndWith(tmpname, ".h264") || strEndWith(tmpname, ".264") || strEndWith(tmpname, ".mvc"))
    {
        if (pid)
        {
            dataReader = &m_containerReader;
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMultiH264);
            if (listIterator)
                dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        }
        else
        {
            dataReader = m_readManager.getReader(fileList[0].c_str());
        }
    }
    else if (strEndWith(tmpname, ".ts") || strEndWith(tmpname, ".m2ts") || strEndWith(tmpname, ".mts") ||
             strEndWith(tmpname, ".ssif"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside TS/M2TS container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".ts"))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctTS);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctM2TS);
    }
    else if (strEndWith(tmpname, ".vob") || strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".mpg"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MPG/VOB/EVO container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        if (strEndWith(tmpname, ".evo") || strEndWith(tmpname, ".evo\""))
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctEVOB);
        else
            codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctVOB);
    }
    else if (strEndWith(tmpname, ".mkv") || strEndWith(tmpname, ".mka") || strEndWith(tmpname, ".mks"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MKV container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMKV);
    }
    else if (strEndWith(tmpname, ".mov") || strEndWith(tmpname, ".mp4") || strEndWith(tmpname, ".m4v") ||
             strEndWith(tmpname, ".m4a"))
    {
        if (pid)
            dataReader = &m_containerReader;
        else
            THROW(ERR_INVALID_CODEC_FORMAT, "For streams inside MOV/MP4 container need track parameter.")
        if (listIterator)
            dynamic_cast<ContainerToReaderWrapper*>(dataReader)->setFileIterator(fileList[0].c_str(), listIterator);
        codecReader->setSrcContainerType(AbstractStreamReader::ContainerType::ctMOV);
    }
    else
    {
        dataReader = m_readManager.getReader(fileList[0].c_str());
    }
    if (dataReader == nullptr)
    {
        delete codecReader;
        THROW(ERR_INVALID_CODEC_FORMAT, "This version do not support multicast or other network steams for muxing")
    }

    m_codecInfo.emplace_back(dataReader, codecReader, fileList[0], codecStreamName, pid, isSubStream);
    if (listIterator)
    {
        auto fileReader = dynamic_cast<BufferedFileReader*>(dataReader);
        if (fileReader)
            fileReader->setFileIterator(listIterator, m_codecInfo.rbegin()->m_readerID);
    }

    StreamInfo& streamInfo = *m_codecInfo.rbegin();
    streamInfo.m_codec = codec;
    streamInfo.m_addParams = addParams;
    int streamIndex = codecReader->getStreamIndex();

    // fields for SS PG stream
    auto pgStream = dynamic_cast<PGSStreamReader*>(codecReader);
    if (pgStream)
    {
        pgStream->isSSPG = isSSPG;
        pgStream->ssPGOffset = ssPGOffset;
        pgStream->leftEyeSubStreamIdx = leftEyeSubStreamIdx;
        pgStream->rightEyeSubStreamIdx = rightEyeSubStreamIdx;
    }
    //

    auto itr = addParams.find("timeshift");
    if (itr != addParams.end())
    {
        string timeShift = itr->second;
        size_t pos = 0;
        int64_t coeff = 1;
        int64_t value = 0;
        if ((pos = timeShift.find("ms")) != std::string::npos)
        {
            coeff = 1000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find('s')) != std::string::npos)
        {
            coeff = 1000000000;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else if ((pos = timeShift.find("ns")) != std::string::npos)
        {
            coeff = 1;
            value = strToInt32(timeShift.substr(0, pos).c_str());
        }
        else
        {
            coeff = 1000000;
            value = strToInt32(timeShift.c_str());
        }
        value = value * coeff / 1000 * INTERNAL_PTS_FREQ / 1000000;
        streamInfo.m_timeShift = value;
        if (value > 0)
            streamInfo.m_lastDTS = value;
    }

    itr = addParams.find("lang");
    if (itr != addParams.end())
        streamInfo.m_lang = itr->second;
    m_totalSize += fileSize;

    return streamIndex;
}